

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

DPSprite * __thiscall player_t::FindPSprite(player_t *this,int layer)

{
  player_t *local_28;
  DPSprite *pspr;
  int layer_local;
  player_t *this_local;
  
  if (layer == 0) {
    this_local = (player_t *)0x0;
  }
  else {
    for (local_28 = (player_t *)::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->psprites);
        (local_28 != (player_t *)0x0 && (*(int *)&(local_28->Vel).X != layer));
        local_28 = (player_t *)::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&local_28->viewz)) {
    }
    this_local = local_28;
  }
  return (DPSprite *)this_local;
}

Assistant:

DPSprite *player_t::FindPSprite(int layer)
{
	if (layer == 0)
		return nullptr;

	DPSprite *pspr = psprites;
	while (pspr)
	{
		if (pspr->ID == layer)
			break;

		pspr = pspr->Next;
	}

	return pspr;
}